

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  char *__src;
  ulong uVar7;
  int iLine;
  char *zFunc;
  int local_dc;
  stat buf;
  ulong uVar8;
  
  local_dc = 1;
  __src = (char *)0x0;
  do {
    while (iVar2 = (*aSyscall[0x1b].pCurrent)(zPath,&buf), iVar2 == 0) {
      if ((buf.st_mode & 0xf000) != 0xa000) goto LAB_0013121a;
      if (__src != (char *)0x0) {
        if (local_dc < 100) {
          local_dc = local_dc + 1;
          goto LAB_001312ae;
        }
        iVar2 = 0x97ae;
LAB_00131353:
        iVar2 = sqlite3CantopenError(iVar2);
        goto LAB_001313c0;
      }
      __src = (char *)sqlite3_malloc(nOut);
      if (__src == (char *)0x0) {
        iVar2 = 7;
        __src = (char *)0x0;
        goto LAB_001313c0;
      }
LAB_001312ae:
      uVar3 = (*aSyscall[0x1a].pCurrent)(zPath,__src,(long)(nOut + -1));
      if ((int)uVar3 < 0) {
        iVar2 = sqlite3CantopenError(0x97b4);
        zFunc = "readlink";
        iLine = 0x97b4;
        goto LAB_001313bb;
      }
      if (*__src != '/') {
        uVar4 = sqlite3Strlen30(zPath);
        uVar8 = (ulong)uVar4;
        do {
          uVar7 = uVar8 - 1;
          if (uVar8 == 0) {
            uVar4 = 0;
            goto LAB_001312f9;
          }
          lVar6 = uVar8 - 1;
          uVar8 = uVar7;
        } while (zPath[lVar6] != '/');
        uVar4 = (int)uVar7 + 1;
LAB_001312f9:
        if (nOut <= (int)(uVar4 + uVar3)) {
          iVar2 = sqlite3CantopenError(0x97ba);
          __src[uVar3 & 0x7fffffff] = '\0';
          goto LAB_001313c0;
        }
        memmove(__src + uVar4,__src,(ulong)(uVar3 + 1));
        memcpy(__src,zPath,(ulong)uVar4);
        uVar3 = uVar4 + uVar3;
      }
      __src[uVar3] = '\0';
      zPath = zOut;
      if (__src != zOut) {
        bVar1 = false;
        zPath = __src;
        goto LAB_00131226;
      }
    }
    piVar5 = __errno_location();
    if (*piVar5 != 2) {
      iVar2 = sqlite3CantopenError(0x97a3);
      zFunc = "lstat";
      iLine = 0x97a3;
LAB_001313bb:
      unixLogErrorAtLine(iVar2,zFunc,zPath,iLine);
      goto LAB_001313c0;
    }
LAB_0013121a:
    bVar1 = true;
    if (zPath == zOut) {
      iVar2 = 0;
      goto LAB_001313c0;
    }
LAB_00131226:
    iVar2 = sqlite3Strlen30(zPath);
    uVar3 = 0;
    if (*zPath != '/') {
      lVar6 = (*aSyscall[3].pCurrent)(zOut,(long)(nOut + -2));
      if (lVar6 == 0) {
        iVar2 = sqlite3CantopenError(0x976a);
        zFunc = "getcwd";
        iLine = 0x976a;
        goto LAB_001313bb;
      }
      uVar4 = sqlite3Strlen30(zOut);
      uVar3 = uVar4 + 1;
      zOut[uVar4] = '/';
    }
    if (nOut <= (int)(iVar2 + uVar3)) {
      zOut[uVar3] = '\0';
      iVar2 = 0x9773;
      goto LAB_00131353;
    }
    iVar2 = 0;
    sqlite3_snprintf(nOut - uVar3,zOut + uVar3,"%s",zPath);
    zPath = zOut;
    if (bVar1) {
LAB_001313c0:
      sqlite3_free(__src);
      return iVar2;
    }
  } while( true );
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
#if !defined(HAVE_READLINK) || !defined(HAVE_LSTAT)
  return mkFullPathname(zPath, zOut, nOut);
#else
  int rc = SQLITE_OK;
  int nByte;
  int nLink = 1;                /* Number of symbolic links followed so far */
  const char *zIn = zPath;      /* Input path for each iteration of loop */
  char *zDel = 0;

  assert( pVfs->mxPathname==MAX_PATHNAME );
  UNUSED_PARAMETER(pVfs);

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. This function could fail if, for example, the
  ** current working directory has been unlinked.
  */
  SimulateIOError( return SQLITE_ERROR );

  do {

    /* Call stat() on path zIn. Set bLink to true if the path is a symbolic
    ** link, or false otherwise.  */
    int bLink = 0;
    struct stat buf;
    if( osLstat(zIn, &buf)!=0 ){
      if( errno!=ENOENT ){
        rc = unixLogError(SQLITE_CANTOPEN_BKPT, "lstat", zIn);
      }
    }else{
      bLink = S_ISLNK(buf.st_mode);
    }

    if( bLink ){
      if( zDel==0 ){
        zDel = sqlite3_malloc(nOut);
        if( zDel==0 ) rc = SQLITE_NOMEM_BKPT;
      }else if( ++nLink>SQLITE_MAX_SYMLINKS ){
        rc = SQLITE_CANTOPEN_BKPT;
      }

      if( rc==SQLITE_OK ){
        nByte = osReadlink(zIn, zDel, nOut-1);
        if( nByte<0 ){
          rc = unixLogError(SQLITE_CANTOPEN_BKPT, "readlink", zIn);
        }else{
          if( zDel[0]!='/' ){
            int n;
            for(n = sqlite3Strlen30(zIn); n>0 && zIn[n-1]!='/'; n--);
            if( nByte+n+1>nOut ){
              rc = SQLITE_CANTOPEN_BKPT;
            }else{
              memmove(&zDel[n], zDel, nByte+1);
              memcpy(zDel, zIn, n);
              nByte += n;
            }
          }
          zDel[nByte] = '\0';
        }
      }

      zIn = zDel;
    }

    assert( rc!=SQLITE_OK || zIn!=zOut || zIn[0]=='/' );
    if( rc==SQLITE_OK && zIn!=zOut ){
      rc = mkFullPathname(zIn, zOut, nOut);
    }
    if( bLink==0 ) break;
    zIn = zOut;
  }while( rc==SQLITE_OK );

  sqlite3_free(zDel);
  return rc;
#endif   /* HAVE_READLINK && HAVE_LSTAT */
}